

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::Set(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQInteger selfidx)

{
  SQObjectType SVar1;
  bool bVar2;
  SQInteger SVar3;
  SQChar *pSVar4;
  SQChar *pSVar5;
  
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    SVar1 = (key->super_SQObject)._type;
    if ((SVar1 >> 0x1a & 1) == 0) {
      pSVar5 = GetTypeName(self);
      pSVar4 = GetTypeName(key);
      Raise_Error(this,"indexing %s with %s",pSVar5,pSVar4);
      return false;
    }
    if (SVar1 == OT_FLOAT) {
      SVar3 = (SQInteger)(key->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (key->super_SQObject)._unVal.nInteger;
    }
    bVar2 = SQArray::Set((self->super_SQObject)._unVal.pArray,SVar3,val);
  }
  else {
    if (SVar1 == OT_INSTANCE) {
      bVar2 = SQInstance::Set((self->super_SQObject)._unVal.pInstance,key,val);
LAB_0012a54c:
      if (bVar2 != false) {
        return true;
      }
    }
    else if (SVar1 != OT_USERDATA) {
      if (SVar1 != OT_TABLE) {
        pSVar5 = GetTypeName(self);
        Raise_Error(this,"trying to set \'%s\'",pSVar5);
        return false;
      }
      bVar2 = SQTable::Set((self->super_SQObject)._unVal.pTable,key,val);
      goto LAB_0012a54c;
    }
    SVar3 = FallBackSet(this,self,key,val);
    if (SVar3 == 0) {
      return true;
    }
    if (SVar3 == 2) {
      return false;
    }
    if (selfidx != 0) goto LAB_0012a615;
    bVar2 = SQTable::Set((this->_roottable).super_SQObject._unVal.pTable,key,val);
  }
  if (bVar2 != false) {
    return true;
  }
LAB_0012a615:
  Raise_IdxError(this,key);
  return false;
}

Assistant:

bool SQVM::Set(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Set(key,val)) return true;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Set(key,val)) return true;
        break;
    case OT_ARRAY:
        if(!sq_isnumeric(key)) { Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key)); return false; }
        if(!_array(self)->Set(tointeger(key),val)) {
            Raise_IdxError(key);
            return false;
        }
        return true;
	case OT_USERDATA: break; // must fall back
    default:
        Raise_Error(_SC("trying to set '%s'"),GetTypeName(self));
        return false;
    }

    switch(FallBackSet(self,key,val)) {
        case FALLBACK_OK: return true; //okie
        case FALLBACK_NO_MATCH: break; //keep falling back
        case FALLBACK_ERROR: return false; // the metamethod failed
    }
    if(selfidx == 0) {
        if(_table(_roottable)->Set(key,val))
            return true;
    }
    Raise_IdxError(key);
    return false;
}